

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O0

ostream * Gs::operator<<(ostream *stream,Matrix<float,_2UL,_2UL> *mat)

{
  size_t sVar1;
  long lVar2;
  float *pfVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  ostream *poVar6;
  char local_d2;
  char local_d1;
  char local_9a;
  char local_99;
  allocator local_71;
  string local_70 [32];
  ulong local_50;
  size_t c_1;
  size_t r_1;
  ulong local_38;
  size_t r;
  size_t c;
  size_t lengths [2];
  Matrix<float,_2UL,_2UL> *mat_local;
  ostream *stream_local;
  
  lengths[1] = (size_t)mat;
  for (r = 0; r < 2; r = r + 1) {
    lengths[r - 1] = 0;
    for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
      lVar2 = r - 1;
      pfVar3 = Matrix<float,_2UL,_2UL>::operator()((Matrix<float,_2UL,_2UL> *)lengths[1],local_38,r)
      ;
      r_1 = Details::Length<float>(pfVar3);
      puVar4 = std::max<unsigned_long>(lengths + lVar2,&r_1);
      lengths[r - 1] = *puVar4;
    }
  }
  for (c_1 = 0; c_1 < 2; c_1 = c_1 + 1) {
    if (c_1 == 0) {
      local_99 = '/';
    }
    else {
      local_9a = '\\';
      if (c_1 != 1) {
        local_9a = '|';
      }
      local_99 = local_9a;
    }
    std::operator<<(stream,local_99);
    for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
      sVar1 = lengths[local_50 - 1];
      pfVar3 = Matrix<float,_2UL,_2UL>::operator()
                         ((Matrix<float,_2UL,_2UL> *)lengths[1],c_1,local_50);
      sVar5 = Details::Length<float>(pfVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,(sVar1 - sVar5) + 1,' ',&local_71);
      std::operator<<(stream,local_70);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      pfVar3 = Matrix<float,_2UL,_2UL>::operator()
                         ((Matrix<float,_2UL,_2UL> *)lengths[1],c_1,local_50);
      poVar6 = (ostream *)std::ostream::operator<<(stream,*pfVar3);
      std::operator<<(poVar6,' ');
    }
    if (c_1 == 0) {
      local_d1 = '\\';
    }
    else {
      local_d2 = '/';
      if (c_1 != 1) {
        local_d2 = '|';
      }
      local_d1 = local_d2;
    }
    poVar6 = std::operator<<(stream,local_d1);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  return stream;
}

Assistant:

std::ostream& operator << (std::ostream& stream, const Matrix<T, Rows, Cols>& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[Matrix<T, Rows, Cols>::columns];

    for (std::size_t c = 0; c < Matrix<T, Rows, Cols>::columns; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < Matrix<T, Rows, Cols>::rows; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    /* Write each row */
    for (std::size_t r = 0; r < Rows; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == Rows ? '\\' : '|');

        for (std::size_t c = 0; c < Cols; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : r + 1 == Rows ? '/' : '|')  << std::endl;
    }

    return stream;
}